

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PRendezvousServer.cpp
# Opt level: O2

void __thiscall
MyServerConnection::OnData(MyServerConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  ostringstream *poVar1;
  OutputWorker *pOVar2;
  shared_ptr<MyServerConnection> *connection;
  __shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar3;
  SDKResult result;
  shared_ptr<MyServerConnection> receiver;
  shared_ptr<MyServerConnection> sender;
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  connections;
  TonkStatusEx local_428;
  TonkStatusEx status;
  LogStringBuffer local_328;
  TonkStatusEx local_1a0;
  TonkStatusEx local_120;
  TonkStatusEx local_a0;
  
  if (bytes != 1 || channel != 0x32) {
    return;
  }
  tonk::SDKConnection::GetStatusEx(&status,&this->super_SDKConnection);
  if (*data == '\0') {
    lVar3 = 0x39;
    if ((int)Logger.ChannelMinLevel < 3) {
      poVar1 = &local_328.LogStream;
      local_328.ChannelName = Logger.ChannelName;
      local_328.LogLevel = Info;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"Sender from ");
      std::operator<<((ostream *)poVar1,status.Remote.NetworkString);
      std::operator<<((ostream *)poVar1," : ");
      std::ostream::operator<<((ostream *)poVar1,status.Remote.UDPPort);
      pOVar2 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar2,&local_328);
LAB_001036ba:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328.LogStream);
    }
  }
  else {
    if (*data != '\x01') goto LAB_001036c8;
    lVar3 = 0x38;
    if ((int)Logger.ChannelMinLevel < 3) {
      poVar1 = &local_328.LogStream;
      local_328.ChannelName = Logger.ChannelName;
      local_328.LogLevel = Info;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"Receiver from ");
      std::operator<<((ostream *)poVar1,status.Remote.NetworkString);
      std::operator<<((ostream *)poVar1," : ");
      std::ostream::operator<<((ostream *)poVar1,status.Remote.UDPPort);
      pOVar2 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar2,&local_328);
      goto LAB_001036ba;
    }
  }
  LOCK();
  *(undefined1 *)((long)&(this->super_SDKConnection)._vptr_SDKConnection + lVar3) = 1;
  UNLOCK();
LAB_001036c8:
  sender.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  sender.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  receiver.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  receiver.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tonk::SDKConnectionList<MyServerConnection>::GetList(&connections,&this->Server->ConnectionList);
  for (; connections.
         super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         connections.
         super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      connections.
      super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(&(connections.
                       super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2> + 1)) {
    this_00 = &receiver.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>;
    if (((((((connections.
              super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->IsReceiver)
          ._M_base._M_i & 1U) != 0) ||
       (this_00 = &sender.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>,
       (((((connections.
            super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->IsSender).
        _M_base._M_i & 1U) != 0)) {
      std::__shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,&(connections.
                           super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  if ((sender.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) &&
     (receiver.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0)) {
    result = tonk::SDKConnection::P2PConnect
                       (&(receiver.
                          super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->super_SDKConnection,
                        &(sender.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_SDKConnection);
    if (result.Result == Tonk_Success) {
      tonk::SDKConnection::GetStatusEx
                (&local_428,
                 &(sender.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_SDKConnection);
      tonk::SDKConnection::GetStatusEx
                (&local_a0,
                 &(sender.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_SDKConnection);
      tonk::SDKConnection::GetStatusEx
                (&local_120,
                 &(receiver.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_SDKConnection);
      tonk::SDKConnection::GetStatusEx
                (&local_1a0,
                 &(receiver.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_SDKConnection);
      if ((int)Logger.ChannelMinLevel < 3) {
        poVar1 = &local_328.LogStream;
        local_328.ChannelName = Logger.ChannelName;
        local_328.LogLevel = Info;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
        std::operator<<((ostream *)poVar1,"P2P connection started between ");
        std::operator<<((ostream *)poVar1,local_428.Remote.NetworkString);
        std::operator<<((ostream *)poVar1," : ");
        std::ostream::operator<<((ostream *)poVar1,local_a0.Remote.UDPPort);
        std::operator<<((ostream *)poVar1," <-> ");
        std::operator<<((ostream *)poVar1,local_120.Remote.NetworkString);
        std::operator<<((ostream *)poVar1," : ");
        std::ostream::operator<<((ostream *)poVar1,local_1a0.Remote.UDPPort);
        pOVar2 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar2,&local_328);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
    }
    else {
      tonk::SDKResult::ToString_abi_cxx11_((string *)&local_428,&result);
      if ((int)Logger.ChannelMinLevel < 4) {
        poVar1 = &local_328.LogStream;
        local_328.ChannelName = Logger.ChannelName;
        local_328.LogLevel = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
        std::operator<<((ostream *)poVar1,"P2P connection failed: ");
        std::operator<<((ostream *)poVar1,(string *)&local_428);
        pOVar2 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar2,&local_328);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
      std::__cxx11::string::~string((string *)&local_428);
    }
  }
  std::
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  ::~vector(&connections);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&receiver.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sender.super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

void MyServerConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (channel == TonkChannel_Reliable0 && bytes == 1)
    {
        auto status = GetStatusEx();

        if (data[0] == 1) {
            Logger.Info("Receiver from ", status.Remote.NetworkString, " : ", status.Remote.UDPPort);
            IsReceiver = true;
        }
        else if (data[0] == 0) {
            Logger.Info("Sender from ", status.Remote.NetworkString, " : ", status.Remote.UDPPort);
            IsSender = true;
        }

        std::shared_ptr<MyServerConnection> sender, receiver;

        auto connections = Server->ConnectionList.GetList();
        for (auto& connection : connections)
        {
            if (connection->IsReceiver) {
                receiver = connection;
            }
            else if (connection->IsSender) {
                sender = connection;
            }
        }

        if (sender && receiver)
        {
            auto result = receiver->P2PConnect(sender.get());

            if (result.Good())
            {
                Logger.Info("P2P connection started between ",
                    sender->GetStatusEx().Remote.NetworkString, " : ",
                    sender->GetStatusEx().Remote.UDPPort, " <-> ",
                    receiver->GetStatusEx().Remote.NetworkString, " : ",
                    receiver->GetStatusEx().Remote.UDPPort);
            }
            else
            {
                Logger.Warning("P2P connection failed: ", result.ToString());
            }
        }
    }
}